

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::
Walker<wasm::RemoveUnusedNames,_wasm::UnifiedExpressionVisitor<wasm::RemoveUnusedNames,_void>_>::
doWalkModule(Walker<wasm::RemoveUnusedNames,_wasm::UnifiedExpressionVisitor<wasm::RemoveUnusedNames,_void>_>
             *this,Module *module)

{
  bool bVar1;
  reference this_00;
  pointer curr_00;
  reference this_01;
  pointer pGVar2;
  reference this_02;
  pointer pFVar3;
  reference this_03;
  pointer pTVar4;
  reference this_04;
  pointer segment;
  reference this_05;
  pointer table;
  reference this_06;
  pointer segment_00;
  reference this_07;
  pointer memory;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *curr_7;
  iterator __end2_7;
  iterator __begin2_7;
  vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
  *__range2_7;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *curr_6;
  iterator __end2_6;
  iterator __begin2_6;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *__range2_6;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *curr_5;
  iterator __end2_5;
  iterator __begin2_5;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *__range2_5;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_4;
  iterator __end2_4;
  iterator __begin2_4;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *__range2_4;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *curr_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *__range2_3;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *curr_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2_2;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range2_1;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  RemoveUnusedNames *self;
  Module *module_local;
  Walker<wasm::RemoveUnusedNames,_wasm::UnifiedExpressionVisitor<wasm::RemoveUnusedNames,_void>_>
  *this_local;
  
  __end2 = std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::begin(&module->exports);
  curr = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
         std::
         vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ::end(&module->exports);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                *)&curr);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
              ::operator*(&__end2);
    curr_00 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::get(this_00);
    Visitor<wasm::RemoveUnusedNames,_void>::visitExport
              ((Visitor<wasm::RemoveUnusedNames,_void> *)this,curr_00);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::begin(&module->globals);
  curr_1 = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
           std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::end(&module->globals);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                        *)&curr_1);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
              ::operator*(&__end2_1);
    pGVar2 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->(this_01);
    bVar1 = Importable::imported(&pGVar2->super_Importable);
    if (bVar1) {
      pGVar2 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::get(this_01);
      Visitor<wasm::RemoveUnusedNames,_void>::visitGlobal
                ((Visitor<wasm::RemoveUnusedNames,_void> *)this,pGVar2);
    }
    else {
      pGVar2 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::get(this_01);
      walkGlobal(this,pGVar2);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin(&module->functions);
  curr_2 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
           std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::end(&module->functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                        *)&curr_2);
    if (!bVar1) break;
    this_02 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
              ::operator*(&__end2_2);
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (this_02);
    bVar1 = Importable::imported(&pFVar3->super_Importable);
    if (bVar1) {
      pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(this_02);
      RemoveUnusedNames::visitFunction
                ((RemoveUnusedNames *)(this[-1].stack.fixed._M_elems + 7),pFVar3);
    }
    else {
      pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(this_02);
      walkFunction(this,pFVar3);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2_2);
  }
  __end2_3 = std::
             vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             ::begin(&module->tags);
  curr_3 = (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)
           std::
           vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
           ::end(&module->tags);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_3,
                       (__normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
                        *)&curr_3);
    if (!bVar1) break;
    this_03 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
              ::operator*(&__end2_3);
    pTVar4 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(this_03);
    bVar1 = Importable::imported(&pTVar4->super_Importable);
    if (bVar1) {
      pTVar4 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::get(this_03);
      Visitor<wasm::RemoveUnusedNames,_void>::visitTag
                ((Visitor<wasm::RemoveUnusedNames,_void> *)this,pTVar4);
    }
    else {
      pTVar4 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::get(this_03);
      walkTag(this,pTVar4);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
    ::operator++(&__end2_3);
  }
  __end2_4 = std::
             vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ::begin(&module->elementSegments);
  curr_4 = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
           std::
           vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ::end(&module->elementSegments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_4,
                       (__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                        *)&curr_4);
    if (!bVar1) break;
    this_04 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
              ::operator*(&__end2_4);
    segment = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::get
                        (this_04);
    walkElementSegment(this,segment);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
    ::operator++(&__end2_4);
  }
  __end2_5 = std::
             vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ::begin(&module->tables);
  curr_5 = (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
           std::
           vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ::end(&module->tables);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_5,
                       (__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                        *)&curr_5);
    if (!bVar1) break;
    this_05 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
              ::operator*(&__end2_5);
    table = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::get(this_05);
    walkTable(this,table);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
    ::operator++(&__end2_5);
  }
  __end2_6 = std::
             vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ::begin(&module->dataSegments);
  curr_6 = (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
           std::
           vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ::end(&module->dataSegments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_6,
                       (__normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
                        *)&curr_6);
    if (!bVar1) break;
    this_06 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
              ::operator*(&__end2_6);
    segment_00 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::get
                           (this_06);
    walkDataSegment(this,segment_00);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
    ::operator++(&__end2_6);
  }
  __end2_7 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::begin(&module->memories);
  curr_7 = (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
           std::
           vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ::end(&module->memories);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_7,
                       (__normal_iterator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_*,_std::vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>_>
                        *)&curr_7);
    if (!bVar1) break;
    this_07 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_*,_std::vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>_>
              ::operator*(&__end2_7);
    memory = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::get(this_07);
    walkMemory(this,memory);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_*,_std::vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>_>
    ::operator++(&__end2_7);
  }
  return;
}

Assistant:

void doWalkModule(Module* module) {
    // Dispatch statically through the SubType.
    SubType* self = static_cast<SubType*>(this);
    for (auto& curr : module->exports) {
      self->visitExport(curr.get());
    }
    for (auto& curr : module->globals) {
      if (curr->imported()) {
        self->visitGlobal(curr.get());
      } else {
        self->walkGlobal(curr.get());
      }
    }
    for (auto& curr : module->functions) {
      if (curr->imported()) {
        self->visitFunction(curr.get());
      } else {
        self->walkFunction(curr.get());
      }
    }
    for (auto& curr : module->tags) {
      if (curr->imported()) {
        self->visitTag(curr.get());
      } else {
        self->walkTag(curr.get());
      }
    }
    for (auto& curr : module->elementSegments) {
      self->walkElementSegment(curr.get());
    }
    for (auto& curr : module->tables) {
      self->walkTable(curr.get());
    }
    for (auto& curr : module->dataSegments) {
      self->walkDataSegment(curr.get());
    }
    for (auto& curr : module->memories) {
      self->walkMemory(curr.get());
    }
  }